

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ThreadContextTTD::AddNewScriptContext_Helper
          (ThreadContextTTD *this,ScriptContext *ctx,
          HostScriptContextCallbackFunctor *callbackFunctor,bool noNative,bool debugMode)

{
  bool bVar1;
  DebugContext *this_00;
  bool debugMode_local;
  bool noNative_local;
  HostScriptContextCallbackFunctor *callbackFunctor_local;
  ScriptContext *ctx_local;
  ThreadContextTTD *this_local;
  
  callbackFunctor_local = (HostScriptContextCallbackFunctor *)ctx;
  ctx_local = (ScriptContext *)this;
  memcpy(&ctx->TTDHostCallbackFunctor,callbackFunctor,0x30);
  if (noNative) {
    Js::ScriptContext::ForceNoNative((ScriptContext *)callbackFunctor_local);
  }
  if (debugMode) {
    this_00 = Js::ScriptContext::GetDebugContext((ScriptContext *)callbackFunctor_local);
    Js::DebugContext::SetDebuggerMode(this_00,Debugging);
  }
  Js::ScriptContext::InitializeCoreImage_TTD((ScriptContext *)callbackFunctor_local);
  bVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
          Contains(&(this->m_contextList).
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   (ScriptContext **)&callbackFunctor_local);
  if (!bVar1) {
    JsUtil::
    List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(&this->m_contextList,(ScriptContext **)&callbackFunctor_local);
    return;
  }
  TTDAbort_unrecoverable_error("We should only be adding at creation time!!!");
}

Assistant:

void ThreadContextTTD::AddNewScriptContext_Helper(Js::ScriptContext* ctx, HostScriptContextCallbackFunctor& callbackFunctor, bool noNative, bool debugMode)
    {
        ////
        //First just setup the standard things needed for a script context
        ctx->TTDHostCallbackFunctor = callbackFunctor;
        if(noNative)
        {
            ctx->ForceNoNative();
        }

        if(debugMode)
        {
#ifdef _WIN32
            ctx->InitializeDebugging();
#else
            //
            //TODO: x-plat does not like some parts of initiallize debugging so just set the flag we need
            //
            ctx->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#endif
        }

        ctx->InitializeCoreImage_TTD();

        TTDAssert(!this->m_contextList.Contains(ctx), "We should only be adding at creation time!!!");
        this->m_contextList.Add(ctx);
    }